

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

AggregateFunction *
duckdb::ApproxQuantileDecimalFunction(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  InternalException *this;
  allocator local_39;
  string local_38;
  
  switch(type->physical_type_) {
  case INT8:
    LogicalType::LogicalType((LogicalType *)&local_38,TINYINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_38);
    break;
  case UINT16:
  case UINT32:
  case UINT64:
switchD_00b8c358_caseD_4:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unimplemented quantile decimal aggregate",&local_39);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case INT16:
    LogicalType::LogicalType((LogicalType *)&local_38,SMALLINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_38);
    break;
  case INT32:
    LogicalType::LogicalType((LogicalType *)&local_38,INTEGER);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_38);
    break;
  case INT64:
    LogicalType::LogicalType((LogicalType *)&local_38,BIGINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_38);
    break;
  default:
    if (type->physical_type_ != INT128) goto switchD_00b8c358_caseD_4;
    LogicalType::LogicalType((LogicalType *)&local_38,HUGEINT);
    GetApproximateQuantileAggregateFunction(__return_storage_ptr__,(LogicalType *)&local_38);
  }
  LogicalType::~LogicalType((LogicalType *)&local_38);
  ::std::__cxx11::string::assign
            ((char *)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                      super_Function.name);
  __return_storage_ptr__->serialize = ApproximateQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ApproximateQuantileBindData::Deserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction ApproxQuantileDecimalFunction(const LogicalType &type) {
	auto function = GetApproximateQuantileDecimalAggregateFunction(type);
	function.name = "approx_quantile";
	function.serialize = ApproximateQuantileBindData::Serialize;
	function.deserialize = ApproximateQuantileBindData::Deserialize;
	return function;
}